

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O1

void __thiscall
BRTS<UFPC>::FindRuns(BRTS<UFPC> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ulong *puVar1;
  ulong *puVar2;
  ushort uVar3;
  uint *puVar4;
  Run *pRVar5;
  short sVar6;
  uint i;
  uint uVar7;
  long lVar8;
  Run *pRVar9;
  Run *pRVar10;
  long lVar11;
  long lVar12;
  Run *pRVar13;
  unsigned_short uVar14;
  uint64_t *puVar15;
  ulong uVar16;
  uint64_t uVar17;
  unsigned_short uVar18;
  long lVar19;
  long lVar20;
  short sVar21;
  ulong *puVar22;
  ulong uVar23;
  Run *local_88;
  
  puVar4 = UFPC::P_;
  lVar8 = (long)data_width;
  uVar17 = *bits_start;
  sVar21 = 0;
  puVar15 = bits_start;
  local_88 = runs;
  do {
    lVar12 = 0;
    if (uVar17 != 0) {
      for (; (uVar17 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
      }
    }
    sVar6 = (short)lVar12;
    if (uVar17 == 0) {
      do {
        puVar15 = puVar15 + 1;
        if (puVar15 == bits_start + lVar8) {
          local_88->start_pos = 0xffff;
          local_88->end_pos = 0xffff;
          if (height < 2) {
LAB_0021d177:
            puVar4 = UFPC::P_;
            uVar7 = 1;
            if (1 < UFPC::length_) {
              uVar16 = 1;
              do {
                if (puVar4[uVar16] < uVar16) {
                  puVar4[uVar16] = puVar4[puVar4[uVar16]];
                }
                else {
                  puVar4[uVar16] = uVar7;
                  uVar7 = uVar7 + 1;
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 < UFPC::length_);
            }
            (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar7;
            return;
          }
          uVar16 = 1;
LAB_0021cfbd:
          pRVar9 = local_88 + 1;
          puVar22 = bits_start + uVar16 * lVar8;
          puVar2 = puVar22 + lVar8;
          uVar23 = *puVar22;
          lVar12 = 0;
          local_88 = pRVar9;
          do {
            lVar19 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            lVar11 = lVar12;
            if (uVar23 == 0) {
              do {
                puVar22 = puVar22 + 1;
                if (puVar22 == puVar2) {
                  local_88->start_pos = 0xffff;
                  local_88->end_pos = 0xffff;
                  uVar16 = uVar16 + 1;
                  runs = pRVar9;
                  if (uVar16 != (uint)height) goto LAB_0021cfbd;
                  goto LAB_0021d177;
                }
                lVar11 = lVar12 + 0x40;
                uVar23 = *puVar22;
                lVar19 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                lVar12 = lVar11;
              } while (uVar23 == 0);
            }
            uVar23 = (~uVar23 >> ((byte)lVar19 & 0x3f)) << ((byte)lVar19 & 0x3f);
            lVar20 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            lVar12 = lVar11;
            if (uVar23 == 0) {
              do {
                lVar12 = lVar12 + 0x40;
                puVar1 = puVar22 + 1;
                puVar22 = puVar22 + 1;
                uVar23 = ~*puVar1;
                lVar20 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
              } while (*puVar1 == 0xffffffffffffffff);
            }
            uVar18 = (unsigned_short)(lVar19 + lVar11);
            pRVar5 = runs + -1;
            pRVar13 = runs;
            do {
              pRVar10 = pRVar5;
              pRVar13 = pRVar13 + 1;
              uVar3 = pRVar10[1].end_pos;
              runs = pRVar10 + 1;
              pRVar5 = runs;
            } while ((uint)uVar3 < ((uint)(lVar19 + lVar11) & 0xffff));
            uVar14 = (unsigned_short)(lVar20 + lVar12);
            uVar7 = (uint)(lVar20 + lVar12) & 0xffff;
            if (uVar7 < runs->start_pos) {
              local_88->start_pos = uVar18;
              local_88->end_pos = uVar14;
              UFPC::P_[UFPC::length_] = UFPC::length_;
              i = UFPC::length_;
              UFPC::length_ = UFPC::length_ + 1;
            }
            else {
              i = UFPC::P_[pRVar10[1].label];
              for (; (uVar3 < uVar7 && (runs = pRVar13, pRVar13->start_pos <= uVar7));
                  pRVar13 = pRVar13 + 1) {
                if (i != UFPC::P_[pRVar13->label]) {
                  i = UFPC::Merge(i,UFPC::P_[pRVar13->label]);
                }
                uVar3 = pRVar13->end_pos;
              }
              local_88->start_pos = uVar18;
              local_88->end_pos = uVar14;
            }
            uVar23 = ~uVar23 & -1L << ((byte)lVar20 & 0x3f);
            local_88->label = i;
            local_88 = local_88 + 1;
          } while( true );
        }
        sVar21 = sVar21 + 0x40;
        uVar17 = *puVar15;
        lVar12 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        sVar6 = (short)lVar12;
      } while (uVar17 == 0);
    }
    uVar16 = (~uVar17 >> ((byte)sVar6 & 0x3f)) << ((byte)sVar6 & 0x3f);
    local_88->start_pos = sVar6 + sVar21;
    lVar12 = 0;
    if (uVar16 != 0) {
      for (; (uVar16 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
      }
    }
    sVar6 = (short)lVar12;
    if (uVar16 == 0) {
      do {
        sVar21 = sVar21 + 0x40;
        puVar22 = puVar15 + 1;
        puVar15 = puVar15 + 1;
        uVar16 = ~*puVar22;
        lVar12 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        sVar6 = (short)lVar12;
      } while (*puVar22 == 0xffffffffffffffff);
    }
    uVar17 = (~uVar16 >> ((byte)sVar6 & 0x3f)) << ((byte)sVar6 & 0x3f);
    local_88->end_pos = sVar6 + sVar21;
    puVar4[UFPC::length_] = UFPC::length_;
    uVar7 = UFPC::length_ + 1;
    local_88->label = UFPC::length_;
    UFPC::length_ = uVar7;
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

void FindRuns(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);

            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::GetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::Merge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }